

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

unsigned_long fmt::v8::detail::bit_cast<unsigned_long,double>(double *source)

{
  unsigned_long dest;
  double *source_local;
  
  return (unsigned_long)*source;
}

Assistant:

FMT_CONSTEXPR20 auto bit_cast(const Source& source) -> Dest {
  static_assert(sizeof(Dest) == sizeof(Source), "size mismatch");
#ifdef __cpp_lib_bit_cast
  if (is_constant_evaluated()) {
    return std::bit_cast<Dest>(source);
  }
#endif
  Dest dest;
  std::memcpy(&dest, &source, sizeof(dest));
  return dest;
}